

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void iterator_inmem_snapshot_seek_test(bool flush_wal)

{
  ulong uVar1;
  fdb_status fVar2;
  size_t sVar5;
  size_t sVar6;
  int iVar3;
  uint uVar4;
  size_t sVar7;
  long lVar8;
  fdb_config *doc;
  fdb_config *pfVar9;
  fdb_iterator **doc_00;
  fdb_doc **doc_01;
  char *pcVar10;
  undefined7 in_register_00000039;
  fdb_iterator *doc_02;
  fdb_doc **unaff_R12;
  long unaff_R13;
  void *__s1;
  ulong uVar11;
  size_t unaff_R15;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_1078;
  uint uStack_106c;
  ulong uStack_1068;
  fdb_iterator *pfStack_1060;
  fdb_file_handle *pfStack_1058;
  fdb_doc **ppfStack_1050;
  fdb_doc *pfStack_1048;
  fdb_kvs_info fStack_1040;
  timeval tStack_1010;
  fdb_kvs_config fStack_1000;
  char acStack_fe8 [256];
  fdb_doc *apfStack_ee8 [101];
  fdb_config fStack_bc0;
  char acStack_ac8 [256];
  char acStack_9c8 [264];
  fdb_iterator **ppfStack_8c0;
  char *pcStack_8b8;
  ulong uStack_8b0;
  char *pcStack_8a8;
  long lStack_8a0;
  fdb_doc **ppfStack_898;
  fdb_iterator *pfStack_880;
  fdb_kvs_handle *pfStack_878;
  fdb_iterator *pfStack_870;
  fdb_file_handle *pfStack_868;
  fdb_doc *apfStack_860 [10];
  timeval tStack_810;
  fdb_kvs_config fStack_800;
  fdb_config fStack_7e8;
  char acStack_6f0 [256];
  char acStack_5f0 [264];
  fdb_config *pfStack_4e8;
  fdb_doc **ppfStack_4e0;
  long lStack_4d8;
  void *pvStack_4d0;
  size_t sStack_4c8;
  code *pcStack_4c0;
  fdb_iterator *local_4b0;
  fdb_config *local_4a8;
  fdb_kvs_handle *local_4a0;
  fdb_kvs_handle *local_498;
  fdb_file_handle *local_490;
  bool local_484;
  fdb_kvs_config local_480;
  fdb_doc *apfStack_468 [6];
  timeval local_438;
  char local_428 [256];
  fdb_config local_328;
  char local_228 [256];
  fdb_config local_128;
  
  sVar5 = CONCAT71(in_register_00000039,flush_wal) & 0xffffffff;
  __s1 = (void *)0x0;
  pcStack_4c0 = (code *)0x115790;
  gettimeofday(&local_438,(__timezone_ptr_t)0x0);
  pcStack_4c0 = (code *)0x115795;
  memleak_start();
  local_4a8 = (fdb_config *)0x0;
  pcStack_4c0 = (code *)0x1157a6;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar9 = &local_128;
  pcStack_4c0 = (code *)0x1157b6;
  fdb_get_default_config();
  pcStack_4c0 = (code *)0x1157c0;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pcStack_4c0 = (code *)0x1157eb;
  fVar2 = fdb_open(&local_490,"./iterator_test1",pfVar9);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    _local_484 = (undefined4)CONCAT71(in_register_00000039,flush_wal);
    pcStack_4c0 = (code *)0x11580b;
    fVar2 = fdb_kvs_open_default(local_490,&local_498,&local_480);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c00;
    unaff_R13 = 0;
    uVar11 = 0;
    do {
      pcStack_4c0 = (code *)0x115836;
      sprintf(local_228,"%c2",(ulong)((int)uVar11 + 0x61));
      pcStack_4c0 = (code *)0x11584f;
      sprintf((char *)&local_328,"meta%d",uVar11 & 0xffffffff);
      pcStack_4c0 = (code *)0x115868;
      sprintf(local_428,"body%d",uVar11 & 0xffffffff);
      unaff_R12 = (fdb_doc **)((long)apfStack_468 + unaff_R13);
      pcStack_4c0 = (code *)0x115878;
      sVar5 = strlen(local_228);
      pfVar9 = &local_328;
      pcStack_4c0 = (code *)0x11588b;
      unaff_R15 = strlen((char *)pfVar9);
      pcStack_4c0 = (code *)0x11589b;
      sVar6 = strlen(local_428);
      pcStack_4c0 = (code *)0x1158c0;
      fdb_doc_create(unaff_R12,local_228,sVar5,pfVar9,unaff_R15,local_428,sVar6);
      pcStack_4c0 = (code *)0x1158cf;
      fdb_set(local_498,apfStack_468[uVar11]);
      uVar11 = uVar11 + 1;
      unaff_R13 = unaff_R13 + 8;
    } while (uVar11 != 5);
    pcStack_4c0 = (code *)0x1158ef;
    fdb_commit(local_490,local_484);
    pcStack_4c0 = (code *)0x115905;
    fVar2 = fdb_snapshot_open(local_498,&local_4a0,0xffffffffffffffff);
    __s1 = (void *)0x5;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c05;
    pcStack_4c0 = (code *)0x115925;
    fVar2 = fdb_set_log_callback(local_498,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c0a;
    pfVar9 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x11595f;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar9,"b2",2,"d2",2,0xe);
    pcStack_4c0 = (code *)0x115978;
    fVar2 = fdb_iterator_seek(local_4b0,"c1",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c0f;
    pcStack_4c0 = (code *)0x115999;
    fVar2 = fdb_iterator_seek(local_4b0,"c3",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c14;
    pfVar9 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x1159af;
    fdb_iterator_close(local_4b0);
    pcStack_4c0 = (code *)0x1159dc;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar9,"b3",2,"d1",2,0xe);
    pcStack_4c0 = (code *)0x1159f5;
    fVar2 = fdb_iterator_seek(local_4b0,"c1",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c19;
    pcStack_4c0 = (code *)0x115a16;
    fVar2 = fdb_iterator_seek(local_4b0,"c3",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c1e;
    pfVar9 = (fdb_config *)&local_4b0;
    pcStack_4c0 = (code *)0x115a2c;
    fdb_iterator_close(local_4b0);
    pcStack_4c0 = (code *)0x115a59;
    fdb_iterator_init(local_4a0,(fdb_iterator **)pfVar9,"b0",2,"e2",2,0xe);
    pcStack_4c0 = (code *)0x115a61;
    fVar2 = fdb_iterator_seek_to_max(local_4b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c23;
    pcStack_4c0 = (code *)0x115a78;
    fVar2 = fdb_iterator_get(local_4b0,(fdb_doc **)&local_4a8);
    doc = local_4a8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c28;
    sVar6._0_2_ = local_4a8->chunksize;
    sVar6._2_2_ = *(undefined2 *)&local_4a8->field_0x2;
    sVar6._4_4_ = local_4a8->blocksize;
    __s1 = *(void **)&local_4a8->seqtree_opt;
    pcStack_4c0 = (code *)0x115a9b;
    iVar3 = bcmp(__s1,"d2",sVar6);
    if (iVar3 != 0) goto LAB_00115c2d;
    pcStack_4c0 = (code *)0x115aab;
    fdb_doc_free((fdb_doc *)doc);
    local_4a8 = (fdb_config *)0x0;
    pcStack_4c0 = (code *)0x115acc;
    fVar2 = fdb_iterator_seek(local_4b0,"e2",2,'\0');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c35;
    pcStack_4c0 = (code *)0x115adf;
    fVar2 = fdb_iterator_seek_to_min(local_4b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c3a;
    pcStack_4c0 = (code *)0x115af6;
    fVar2 = fdb_iterator_get(local_4b0,(fdb_doc **)&local_4a8);
    pfVar9 = local_4a8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115c3f;
    sVar7._0_2_ = local_4a8->chunksize;
    sVar7._2_2_ = *(undefined2 *)&local_4a8->field_0x2;
    sVar7._4_4_ = local_4a8->blocksize;
    __s1 = *(void **)&local_4a8->seqtree_opt;
    pcStack_4c0 = (code *)0x115b19;
    iVar3 = bcmp(__s1,"c2",sVar7);
    if (iVar3 != 0) goto LAB_00115c44;
    pcStack_4c0 = (code *)0x115b29;
    fdb_doc_free((fdb_doc *)pfVar9);
    pcStack_4c0 = (code *)0x115b44;
    fVar2 = fdb_iterator_seek(local_4b0,"b0",2,'\x01');
    if (fVar2 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115c4c;
    pcStack_4c0 = (code *)0x115b68;
    fVar2 = fdb_iterator_seek(local_4b0,"b0",2,'\x01');
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      pcStack_4c0 = (code *)0x115b7b;
      fdb_iterator_close(local_4b0);
      pcStack_4c0 = (code *)0x115b85;
      fdb_kvs_close(local_498);
      pcStack_4c0 = (code *)0x115b8f;
      fdb_kvs_close(local_4a0);
      pcStack_4c0 = (code *)0x115b99;
      fdb_close(local_490);
      lVar8 = 0;
      do {
        pcStack_4c0 = (code *)0x115ba5;
        fdb_doc_free(apfStack_468[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      pcStack_4c0 = (code *)0x115bb3;
      fdb_shutdown();
      pcStack_4c0 = (code *)0x115bb8;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pcStack_4c0 = (code *)0x115be9;
      fprintf(_stderr,pcVar10,"in-memory snapshot seek test");
      return;
    }
  }
  else {
    pcStack_4c0 = (code *)0x115c00;
    iterator_inmem_snapshot_seek_test();
LAB_00115c00:
    pcStack_4c0 = (code *)0x115c05;
    iterator_inmem_snapshot_seek_test();
LAB_00115c05:
    pcStack_4c0 = (code *)0x115c0a;
    iterator_inmem_snapshot_seek_test();
LAB_00115c0a:
    pcStack_4c0 = (code *)0x115c0f;
    iterator_inmem_snapshot_seek_test();
LAB_00115c0f:
    pcStack_4c0 = (code *)0x115c14;
    iterator_inmem_snapshot_seek_test();
LAB_00115c14:
    pcStack_4c0 = (code *)0x115c19;
    iterator_inmem_snapshot_seek_test();
LAB_00115c19:
    pcStack_4c0 = (code *)0x115c1e;
    iterator_inmem_snapshot_seek_test();
LAB_00115c1e:
    pcStack_4c0 = (code *)0x115c23;
    iterator_inmem_snapshot_seek_test();
LAB_00115c23:
    pcStack_4c0 = (code *)0x115c28;
    iterator_inmem_snapshot_seek_test();
LAB_00115c28:
    doc = pfVar9;
    pcStack_4c0 = (code *)0x115c2d;
    iterator_inmem_snapshot_seek_test();
LAB_00115c2d:
    pcStack_4c0 = (code *)0x115c35;
    iterator_inmem_snapshot_seek_test();
LAB_00115c35:
    pcStack_4c0 = (code *)0x115c3a;
    iterator_inmem_snapshot_seek_test();
LAB_00115c3a:
    pcStack_4c0 = (code *)0x115c3f;
    iterator_inmem_snapshot_seek_test();
LAB_00115c3f:
    pfVar9 = doc;
    pcStack_4c0 = (code *)0x115c44;
    iterator_inmem_snapshot_seek_test();
LAB_00115c44:
    pcStack_4c0 = (code *)0x115c4c;
    iterator_inmem_snapshot_seek_test();
LAB_00115c4c:
    pcStack_4c0 = (code *)0x115c51;
    iterator_inmem_snapshot_seek_test();
  }
  pcStack_4c0 = iterator_no_deletes_test;
  iterator_inmem_snapshot_seek_test();
  ppfStack_898 = (fdb_doc **)0x115c76;
  pfStack_4e8 = pfVar9;
  ppfStack_4e0 = unaff_R12;
  lStack_4d8 = unaff_R13;
  pvStack_4d0 = __s1;
  sStack_4c8 = unaff_R15;
  pcStack_4c0 = (code *)sVar5;
  gettimeofday(&tStack_810,(__timezone_ptr_t)0x0);
  ppfStack_898 = (fdb_doc **)0x115c7b;
  memleak_start();
  pfStack_880 = (fdb_iterator *)0x0;
  ppfStack_898 = (fdb_doc **)0x115c90;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_898 = (fdb_doc **)0x115ca0;
  fdb_get_default_config();
  ppfStack_898 = (fdb_doc **)0x115cb0;
  fdb_get_default_kvs_config();
  fStack_7e8.wal_threshold = 0x400;
  fStack_7e8.flags = 1;
  fStack_7e8.compaction_threshold = '\0';
  ppfStack_898 = (fdb_doc **)0x115cda;
  fdb_open(&pfStack_868,"./iterator_test",&fStack_7e8);
  ppfStack_898 = (fdb_doc **)0x115cf1;
  fdb_kvs_open(pfStack_868,&pfStack_878,"all_docs",&fStack_800);
  lVar8 = 0;
  uVar11 = 0;
  do {
    ppfStack_898 = (fdb_doc **)0x115d1b;
    sprintf(acStack_5f0,"key%d",uVar11 & 0xffffffff);
    ppfStack_898 = (fdb_doc **)0x115d2f;
    sprintf(acStack_6f0,"body%d",uVar11 & 0xffffffff);
    doc_01 = (fdb_doc **)((long)apfStack_860 + lVar8);
    ppfStack_898 = (fdb_doc **)0x115d3f;
    sVar5 = strlen(acStack_5f0);
    ppfStack_898 = (fdb_doc **)0x115d4a;
    sVar6 = strlen(acStack_6f0);
    ppfStack_898 = (fdb_doc **)0x115d64;
    fdb_doc_create(doc_01,acStack_5f0,sVar5,(void *)0x0,0,acStack_6f0,sVar6);
    ppfStack_898 = (fdb_doc **)0x115d73;
    fdb_set(pfStack_878,apfStack_860[uVar11]);
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 8;
  } while (uVar11 != 10);
  doc_00 = (fdb_iterator **)0x0;
  do {
    ppfStack_898 = (fdb_doc **)0x115d98;
    fVar2 = fdb_del_kv(pfStack_878,apfStack_860[(long)doc_00]->key,
                       apfStack_860[(long)doc_00]->keylen);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      ppfStack_898 = (fdb_doc **)0x115f06;
      iterator_no_deletes_test();
      goto LAB_00115f06;
    }
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0xa);
  ppfStack_898 = (fdb_doc **)0x115db5;
  fdb_commit(pfStack_868,'\0');
  ppfStack_898 = (fdb_doc **)0x115dc4;
  fVar2 = fdb_set(pfStack_878,apfStack_860[2]);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    doc_00 = &pfStack_880;
    ppfStack_898 = (fdb_doc **)0x115df5;
    fdb_doc_create((fdb_doc **)doc_00,apfStack_860[2]->key,apfStack_860[2]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_898 = (fdb_doc **)0x115e02;
    fVar2 = fdb_get(pfStack_878,(fdb_doc *)pfStack_880);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00115f0b;
    doc_02 = pfStack_880;
    if (*(bool *)&pfStack_880->start_key != false) {
      doc_00 = &pfStack_870;
      ppfStack_898 = (fdb_doc **)0x115e27;
      iterator_no_deletes_test();
      doc_02 = pfStack_870;
    }
    ppfStack_898 = (fdb_doc **)0x115e2f;
    fdb_doc_free((fdb_doc *)doc_02);
    pfStack_880 = (fdb_iterator *)0x0;
    ppfStack_898 = (fdb_doc **)0x115e58;
    fVar2 = fdb_iterator_init(pfStack_878,&pfStack_870,(void *)0x0,0,(void *)0x0,0,2);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      ppfStack_898 = (fdb_doc **)0x115e6f;
      fVar2 = fdb_iterator_get(pfStack_870,(fdb_doc **)&pfStack_880);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        ppfStack_898 = (fdb_doc **)0x115e81;
        fdb_doc_free((fdb_doc *)pfStack_880);
        ppfStack_898 = (fdb_doc **)0x115e8b;
        fdb_iterator_close(pfStack_870);
        lVar8 = 0;
        do {
          ppfStack_898 = (fdb_doc **)0x115e97;
          fdb_doc_free(apfStack_860[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        ppfStack_898 = (fdb_doc **)0x115eaa;
        fdb_kvs_close(pfStack_878);
        ppfStack_898 = (fdb_doc **)0x115eb4;
        fdb_close(pfStack_868);
        ppfStack_898 = (fdb_doc **)0x115eb9;
        fdb_shutdown();
        ppfStack_898 = (fdb_doc **)0x115ebe;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (iterator_no_deletes_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        ppfStack_898 = (fdb_doc **)0x115eef;
        fprintf(_stderr,pcVar10,"iterator no deletes test");
        return;
      }
      goto LAB_00115f15;
    }
  }
  else {
LAB_00115f06:
    ppfStack_898 = (fdb_doc **)0x115f0b;
    iterator_no_deletes_test();
LAB_00115f0b:
    ppfStack_898 = (fdb_doc **)0x115f10;
    iterator_no_deletes_test();
  }
  ppfStack_898 = (fdb_doc **)0x115f15;
  iterator_no_deletes_test();
LAB_00115f15:
  ppfStack_898 = (fdb_doc **)iterator_set_del_docs_test;
  iterator_no_deletes_test();
  ppfStack_8c0 = doc_00;
  pcStack_8b8 = acStack_6f0;
  uStack_8b0 = uVar11;
  pcStack_8a8 = acStack_5f0;
  lStack_8a0 = lVar8;
  ppfStack_898 = doc_01;
  gettimeofday(&tStack_1010,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fStack_bc0.wal_threshold = 0x400;
  fStack_bc0.flags = 1;
  fStack_bc0.compaction_threshold = '\n';
  fStack_bc0.purging_interval = 1;
  fdb_open(&pfStack_1058,"./iterator_test1",&fStack_bc0);
  fdb_kvs_open(pfStack_1058,&pfStack_1078,"kv1",&fStack_1000);
  uStack_1068 = 0;
  uVar4 = 0;
  do {
    lVar8 = 0;
    uVar11 = 0;
    uStack_106c = uVar4;
    do {
      uVar4 = uStack_106c;
      sprintf(acStack_9c8,"key%02d%03d",(ulong)uStack_106c,uVar11 & 0xffffffff);
      sprintf(acStack_ac8,"meta%02d%03d",(ulong)uVar4,uVar11 & 0xffffffff);
      sprintf(acStack_fe8,"body%02d%03d",(ulong)uVar4,uVar11 & 0xffffffff);
      ppfStack_1050 = (fdb_doc **)((long)apfStack_ee8 + lVar8);
      sVar5 = strlen(acStack_9c8);
      sVar6 = strlen(acStack_ac8);
      sVar7 = strlen(acStack_fe8);
      fdb_doc_create(ppfStack_1050,acStack_9c8,sVar5,acStack_ac8,sVar6,acStack_fe8,sVar7);
      fdb_set(pfStack_1078,apfStack_ee8[uVar11]);
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar11 != 100);
    fdb_commit(pfStack_1058,'\x01');
    lVar8 = 0;
    do {
      fdb_del(pfStack_1078,apfStack_ee8[lVar8 + 0x19]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x19);
    uVar11 = uStack_1068 + 0x4b;
    fdb_commit(pfStack_1058,'\x01');
    fdb_get_kvs_info(pfStack_1078,&fStack_1040);
    uStack_1068 = uVar11;
    if (fStack_1040.doc_count != uVar11) {
      uVar11 = 0;
      fdb_iterator_init(pfStack_1078,&pfStack_1060,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(pfStack_1060,&pfStack_1048);
        uVar11 = (ulong)((int)uVar11 + (pfStack_1048->deleted ^ 1));
        fdb_doc_free(pfStack_1048);
        fVar2 = fdb_iterator_next(pfStack_1060);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(pfStack_1060);
      uVar1 = uStack_1068;
      printf("dbdocs(%d) expected(%d)\n",uVar11,uStack_1068 & 0xffffffff);
      if (fStack_1040.doc_count != uVar1) {
        iterator_set_del_docs_test();
      }
    }
    lVar8 = 0;
    do {
      fdb_doc_free(apfStack_ee8[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 100);
    uVar4 = uStack_106c + 1;
  } while (uVar4 != 0x14);
  fdb_kvs_close(pfStack_1078);
  fdb_close(pfStack_1058);
  fdb_shutdown();
  memleak_end();
  pcVar10 = "%s PASSED\n";
  if (iterator_set_del_docs_test()::__test_pass != '\0') {
    pcVar10 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar10,"iterator set del docs");
  return;
}

Assistant:

void iterator_inmem_snapshot_seek_test(bool flush_wal)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 5;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    status = fdb_open(&dbfile, "./iterator_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "%c2",(char)i + 'a');
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    if (flush_wal) {
        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    } else {
        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    }
    // ---------- Snapshot tests begin -----------------------
    // WAL items are not flushed...
    status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_inmem_snapshot_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b2", 2, (void*)"d2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on the start key which
    // should not be returned since we have passed ITR_SKIP_MIN_KEY
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to land on the end key which
    // should not be returned since we have passed ITR_SKIP_MAX_KEY
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for full range
    fdb_iterator_init(snap_db, &iterator, (void*)"b3", 2, (void*)"d1", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to non-existent key that happens to land on key that is
    // smaller than the start key which should not be returned.
    status = fdb_iterator_seek(iterator, "c1", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to non-existent key that happens to be land on key larger than
    // end key which should not be returned.
    status = fdb_iterator_seek(iterator, "c3", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // create an iterator on the snapshot for just 3 items within range
    fdb_iterator_init(snap_db, &iterator, (void*)"b0", 2, (void*)"e2", 2,
                      FDB_ITR_NO_DELETES|
                      FDB_ITR_SKIP_MAX_KEY|
                      FDB_ITR_SKIP_MIN_KEY);

    // seek to max key but skip max key
    // should return a key for fdb_iterator_seek_to_max
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "d2", rdoc->keylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // But same attempt with regular seek to max key
    // no key should be returned since we want to skip max key
    status = fdb_iterator_seek(iterator, "e2", 2, FDB_ITR_SEEK_HIGHER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to min key but skip min key
    // should return a key for fdb_iterator_seek_to_min
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->key, "c2", rdoc->keylen);
    fdb_doc_free(rdoc);

    // But same attempt with regular seek to min key
    // no key should be returned since we want to skip min key
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    // seek to key outside the range that happens to land on non-existent key
    // no key should be returned
    status = fdb_iterator_seek(iterator, "b0", 2, FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    fdb_iterator_close(iterator);

    // close db handle
    fdb_kvs_close(db);
    // close snapshot handle
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot seek test");
}